

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

void __thiscall
mjs::global_object_impl::global_object_impl
          (global_object_impl *this,gc_heap *h,version ver,bool *strict_mode)

{
  gc_heap *h_00;
  gc_heap_ptr_untracked<mjs::object,_true> *local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  string local_68;
  undefined1 local_58 [32];
  string local_38;
  bool *local_28;
  bool *strict_mode_local;
  gc_heap *pgStack_18;
  version ver_local;
  gc_heap *h_local;
  global_object_impl *this_local;
  
  local_28 = strict_mode;
  strict_mode_local._4_4_ = ver;
  pgStack_18 = h;
  h_local = (gc_heap *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(local_58 + 0x10),"Global");
  string::string(&local_38,h,(basic_string_view<char,_std::char_traits<char>_> *)(local_58 + 0x10));
  h_00 = pgStack_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"Object");
  string::string(&local_68,h_00,&local_78);
  gc_heap::make<mjs::object,mjs::string,decltype(nullptr)>
            ((gc_heap *)local_58,(string *)h_00,(void **)&local_68);
  global_object::object(&this->super_global_object,&local_38,(object_ptr *)local_58);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_58);
  string::~string(&local_68);
  string::~string(&local_38);
  (this->super_global_object).super_object._vptr_object = (_func_int **)&PTR_get_0028c3b0;
  anon_unknown_35::string_cache::string_cache(&this->string_cache_,pgStack_18,0x10);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&this->object_prototype_);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&this->function_prototype_);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&this->array_prototype_);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&this->string_prototype_);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&this->boolean_prototype_);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&this->number_prototype_);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&this->regexp_prototype_);
  local_c0 = this->error_prototype_;
  do {
    gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(local_c0);
    local_c0 = local_c0 + 1;
  } while (local_c0 != &this->thrower_);
  gc_heap_ptr_untracked<mjs::object,_true>::gc_heap_ptr_untracked(&this->thrower_);
  (this->super_global_object).version_ = strict_mode_local._4_4_;
  (this->super_global_object).strict_mode_ = local_28;
  return;
}

Assistant:

explicit global_object_impl(gc_heap& h, version ver, bool& strict_mode)
        : global_object(string{h, "Global"}
            , h.make<object>(string{h, "Object"}, nullptr))
        , string_cache_(h, 16) {
        version_ = ver;
        strict_mode_ = &strict_mode;
    }